

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O3

int __thiscall hwnet::Epoll::RunOnce(Epoll *this)

{
  undefined8 *puVar1;
  uint uVar2;
  int *piVar3;
  epoll_event *peVar4;
  long lVar5;
  
  do {
    uVar2 = epoll_wait(this->epfd,(epoll_event *)this->events,this->maxevents,-1);
    if (uVar2 != 0xffffffff) {
      if ((int)uVar2 < 1) {
        return -1;
      }
      lVar5 = 0;
      do {
        puVar1 = *(undefined8 **)((long)&this->events->data + lVar5);
        (**(code **)*puVar1)(puVar1,*(undefined4 *)((long)&this->events->events + lVar5));
        lVar5 = lVar5 + 0xc;
      } while ((ulong)uVar2 * 0xc != lVar5);
      if (uVar2 == this->maxevents) {
        this->maxevents = uVar2 << 2;
        peVar4 = (epoll_event *)realloc(this->events,(long)(int)(uVar2 << 2) * 0xc);
        if (peVar4 == (epoll_event *)0x0) {
          return -1;
        }
        this->events = peVar4;
      }
      return 0;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return -1;
}

Assistant:

int Epoll::RunOnce() {
	epoll_event *tmp;
	auto nfds = TEMP_FAILURE_RETRY(epoll_wait(this->epfd,this->events,this->maxevents,-1));
	if(nfds > 0) {
		for(auto i=0; i < nfds ; ++i) {
			epoll_event *event = &events[i];
			((Channel*)event->data.ptr)->OnActive(event->events);
		}	
		if(nfds == this->maxevents){
			this->maxevents <<= 2;
			tmp = (epoll_event*)realloc(this->events,sizeof(*this->events)*this->maxevents);
			if(nullptr == tmp) {
				//log error
				return -1;
			}
			this->events = tmp;
		}
		return 0;			
	} else {
		//log error
		return -1;
	}
}